

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O1

void __thiscall google::protobuf::Method::Clear(Method *this)

{
  string *psVar1;
  
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Option>::TypeHandler>
            (&(this->options_).super_RepeatedPtrFieldBase);
  psVar1 = (this->name_).ptr_;
  if (psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  psVar1 = (this->request_type_url_).ptr_;
  if (psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  psVar1 = (this->response_type_url_).ptr_;
  if (psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  this->request_streaming_ = false;
  this->response_streaming_ = false;
  *(undefined2 *)&this->field_0x42 = 0;
  this->syntax_ = 0;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void Method::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.Method)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  options_.Clear();
  name_.ClearToEmpty(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  request_type_url_.ClearToEmpty(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  response_type_url_.ClearToEmpty(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::memset(&request_streaming_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&syntax_) -
      reinterpret_cast<char*>(&request_streaming_)) + sizeof(syntax_));
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}